

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_583a4::CustomAPNGAsmListener::onPostAddFrame
          (CustomAPNGAsmListener *this,APNGFrame *frame)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"New Frame => Delay=(");
  apngasm::APNGFrame::delayNum((uint)frame);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"/");
  apngasm::APNGFrame::delayDen((uint)frame);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,") sec");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void onPostAddFrame(const apngasm::APNGFrame &frame) const {
    apngasm::APNGFrame &tmp = const_cast<apngasm::APNGFrame &>(frame);
    std::cout << "New Frame => Delay=(" << tmp.delayNum() << "/"
              << tmp.delayDen() << ") sec" << std::endl;
  }